

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_show_all_books_in_churches.hpp
# Opt level: O0

void __thiscall
PatchShowAllBooksInChurches::inject_code(PatchShowAllBooksInChurches *this,ROM *rom,World *world)

{
  uint16_t value;
  initializer_list<unsigned_short> __l;
  bool bVar1;
  uint32_t uVar2;
  reference puVar3;
  Code *pCVar4;
  Code local_268;
  allocator<char> local_1e9;
  string local_1e8;
  uint32_t local_1c4;
  undefined1 local_1c0 [4];
  uint32_t func_addr;
  allocator<char> local_1a9;
  string local_1a8;
  DataRegister local_188;
  allocator<char> local_171;
  string local_170;
  DataRegister local_150;
  uint16_t local_13a;
  iterator iStack_138;
  uint16_t map_id;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  Param local_110 [2];
  undefined1 local_100 [8];
  Code func;
  uint32_t JUMP_ADDR_DO_ITEM_REMOVAL;
  uint32_t JUMP_ADDR_SKIP_ITEM_REMOVAL;
  allocator<unsigned_short> local_69;
  unsigned_short local_68 [16];
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> maps_to_check;
  World *world_local;
  ROM *rom_local;
  PatchShowAllBooksInChurches *this_local;
  
  local_68[0] = 0x1a5;
  local_68[1] = 0x255;
  local_68[2] = 0x25f;
  local_68[3] = 0x265;
  local_68[4] = 699;
  local_68[5] = 0x2d1;
  local_68[6] = 0x2e0;
  local_68[7] = 0x2ed;
  local_68[8] = 0x131;
  local_68[9] = 0x188;
  local_48 = local_68;
  local_40 = 10;
  maps_to_check.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)world;
  std::allocator<unsigned_short>::allocator(&local_69);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38,__l,&local_69);
  std::allocator<unsigned_short>::~allocator(&local_69);
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0x1969a;
  md::Code::Code((Code *)local_100);
  addr_<void>((uint32_t)local_110,0xff1204);
  md::DataRegister::DataRegister((DataRegister *)&__range1,'\x02');
  md::Code::movew((Code *)local_100,local_110,(Param *)&__range1);
  __end1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  iStack_138 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      (&__end1,&stack0xfffffffffffffec8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&__end1);
    value = *puVar3;
    local_13a = value;
    md::DataRegister::DataRegister(&local_150,'\x02');
    md::Code::cmpiw((Code *)local_100,value,(Param *)&local_150);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"special_map",&local_171);
    md::Code::beq((Code *)local_100,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&__end1);
  }
  md::DataRegister::DataRegister(&local_188,'\x02');
  md::Code::clrw((Code *)local_100,(Param *)&local_188);
  md::Code::jmp((Code *)local_100,0x1969a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"special_map",&local_1a9);
  md::Code::label((Code *)local_100,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  md::DataRegister::DataRegister((DataRegister *)local_1c0,'\x02');
  md::Code::clrw((Code *)local_100,(Param *)local_1c0);
  md::Code::jmp((Code *)local_100,0x196bc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_1e9);
  uVar2 = md::ROM::inject_code(rom,(Code *)local_100,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  local_268._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_268._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_268._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_268._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_268._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_268._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_268._labels._M_t._M_impl._0_8_ = 0;
  local_268._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_268._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_268._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_268._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_268._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_268._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268._pending_branches._M_t._M_impl._0_8_ = 0;
  local_268._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c4 = uVar2;
  md::Code::Code(&local_268);
  pCVar4 = md::Code::jmp(&local_268,local_1c4);
  pCVar4 = md::Code::nop(pCVar4,3);
  md::ROM::set_code(rom,0x1968e,pCVar4);
  md::Code::~Code(&local_268);
  md::Code::~Code((Code *)local_100);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        std::vector<uint16_t> maps_to_check = {
                MAP_STAIRWAY_TO_NOLE,
                MAP_MASSAN_CHURCH, MAP_GUMI_CHURCH, MAP_RYUMA_CHURCH, MAP_MERCATOR_CHURCH,
                MAP_VERLA_CHURCH, MAP_DESTEL_CHURCH, MAP_KAZALT_CHURCH,
                MAP_LAKE_SHRINE_SAVE_ROOM, MAP_KN_LABYRINTH_SAVE_ROOM
        };

        constexpr uint32_t JUMP_ADDR_SKIP_ITEM_REMOVAL = 0x196BC;
        constexpr uint32_t JUMP_ADDR_DO_ITEM_REMOVAL = 0x1969A;

        md::Code func;
        func.movew(addr_(0xFF1204), reg_D2);
        for(uint16_t map_id : maps_to_check)
        {
            func.cmpiw(map_id, reg_D2);
            func.beq("special_map");
        }
        func.clrw(reg_D2);
        func.jmp(JUMP_ADDR_DO_ITEM_REMOVAL); // Regular map, do the item removal as usual

        func.label("special_map");
        func.clrw(reg_D2);
        func.jmp(JUMP_ADDR_SKIP_ITEM_REMOVAL); // Special map, do not perform the item removal

        uint32_t func_addr = rom.inject_code(func);
        rom.set_code(0x1968E, md::Code().jmp(func_addr).nop(3));
    }